

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBuilderBeamIGA::BuildBeam
          (ChBuilderBeamIGA *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,ChVector<double> *Ydir,int order)

{
  undefined1 auVar1 [16];
  ChMesh *pCVar2;
  undefined1 auVar3 [16];
  ChVariablesBodyOwnMass *pCVar4;
  element_type *peVar5;
  Scalar *__x;
  long lVar6;
  int i_el_node;
  uint uVar7;
  long lVar8;
  int i_el_knot;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  ChVector<double> v_1;
  ChVectorDynamic<> myknots;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  mynodes;
  ChVector<double> v;
  ChMatrix33<double> mrot;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  ChVector<double> local_1e8;
  shared_ptr<chrono::fea::ChMesh> *local_1c8;
  ulong local_1c0;
  ChBuilderBeamIGA *local_1b8;
  __shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2> *local_1b0;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_1a8;
  ChVector<double> *local_1a0;
  shared_ptr<chrono::fea::ChElementBase> local_198;
  Matrix<double,__1,_1,_0,__1,_1> local_188;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_178;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2> local_148;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_138;
  _Vector_base<double,_std::allocator<double>_> local_120;
  undefined1 local_108 [16];
  double local_f8;
  ChMatrix33<double> local_78;
  
  local_1c8 = mesh;
  local_1b0 = &sect->
               super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ::clear(&this->beam_elems);
  local_1a8 = &this->beam_nodes;
  local_1b8 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(local_1a8);
  local_108 = vsubpd_avx(*(undefined1 (*) [16])B->m_data,*(undefined1 (*) [16])A->m_data);
  local_f8 = B->m_data[2] - A->m_data[2];
  local_1a0 = B;
  ChMatrix33<double>::Set_A_Xdir(&local_78,(ChVector<double> *)local_108,Ydir);
  uVar7 = order + N;
  local_108._0_4_ = order + 1 + uVar7;
  local_1c0 = (ulong)(uint)N;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_188,(int *)local_108);
  geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(&local_188,order,0.0,1.0);
  local_178.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar9 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar9; uVar9 = uVar9 + 1) {
    auVar1 = *(undefined1 (*) [16])A->m_data;
    dVar13 = (double)(int)uVar9 / (double)(int)(uVar7 - 1);
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])local_1a0->m_data,auVar1);
    local_1e8.m_data[2] = A->m_data[2] + dVar13 * (local_1a0->m_data[2] - A->m_data[2]);
    local_1e8.m_data[0] = auVar1._0_8_ + dVar13 * auVar3._0_8_;
    local_1e8.m_data[1] = auVar1._8_8_ + dVar13 * auVar3._8_8_;
    ChFrame<double>::ChFrame((ChFrame<double> *)local_108,&local_1e8,&local_78);
    chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
              ((chrono_types *)&local_1f8,(ChFrame<double> *)local_108);
    pCVar2 = (local_1c8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>(local_158,&local_1f8);
    ChMesh::AddNode(pCVar2,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(&local_178,(value_type *)&local_1f8);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(local_1a8,(value_type *)&local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  }
  uVar7 = order * 2 + 2;
  uVar9 = (uint)local_1c0;
  lVar6 = 0;
  for (uVar12 = 0; uVar12 != (~((int)uVar9 >> 0x1f) & uVar9); uVar12 = uVar12 + 1) {
    local_f8 = 0.0;
    local_108 = ZEXT816(0);
    for (uVar10 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar10; uVar10 = uVar10 + 1) {
      __x = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_188,
                       uVar12 + uVar10);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_108,__x);
    }
    local_1e8.m_data[2] = 0.0;
    local_1e8.m_data[0] = 0.0;
    local_1e8.m_data[1] = 0.0;
    lVar11 = lVar6;
    for (lVar8 = 0; lVar8 <= order; lVar8 = lVar8 + 1) {
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   *)&local_1e8,
                  (value_type *)
                  ((long)&((local_178.
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + lVar11));
      lVar11 = lVar11 + 0x10;
    }
    std::make_shared<chrono::fea::ChElementBeamIGA>();
    peVar5 = local_1f8._M_ptr;
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::vector(&local_138,
             (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              *)&local_1e8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_120,
               (vector<double,_std::allocator<double>_> *)local_108);
    (*(peVar5->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x1c])
              (peVar5,&local_138,&local_120,(ulong)(uint)order);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::~vector(&local_138);
    pCVar4 = &(local_1f8._M_ptr)->variables;
    std::__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,local_1b0);
    std::__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2> *)
               ((pCVar4->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               + 5),&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
    pCVar2 = (local_1c8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementBeamIGA,void>
              ((__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> *)&local_198,
               (__shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2> *)&local_1f8
              );
    ChMesh::AddElement(pCVar2,&local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_198.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
    ::push_back(&local_1b8->beam_elems,(value_type *)&local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               *)&local_1e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_108);
    lVar6 = lVar6 + 0x10;
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector(&local_178);
  Eigen::internal::handmade_aligned_free
            (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChBuilderBeamIGA::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                 std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                 const int N,                                  // number of elements in the segment
                                 const ChVector<> A,                           // starting point
                                 const ChVector<> B,                           // ending point
                                 const ChVector<> Ydir,                        // the 'up' Y direction of the beam
                                 const int order                               // the order of spline (default=3,cubic)
) {
    beam_elems.clear();
    beam_nodes.clear();

    // rotation of all nodes
    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    int p = order;

    // Create the 'complete' knot vector, with multiple at the ends
    ChVectorDynamic<> myknots(N + p + p + 1);
    geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(myknots, p, 0.0, 1.0);

    // Create the 'complete' stl vector of control points, with uniform distribution
    std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes;
    for (int i_node = 0; i_node < N + p; ++i_node) {
        double abscyssa = ((double)i_node / (double)(N + p - 1));

        // position of node
        ChVector<> pos = A + (B - A) * abscyssa;

        auto hnode_i = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(hnode_i);
        mynodes.push_back(hnode_i);
        this->beam_nodes.push_back(hnode_i);
    }

    // Create the single elements by picking a subset of the nodes and control points
    for (int i_el = 0; i_el < N; ++i_el) {
        std::vector<double> my_el_knots;
        for (int i_el_knot = 0; i_el_knot < p + p + 1 + 1; ++i_el_knot) {
            my_el_knots.push_back(myknots(i_el + i_el_knot));
        }

        std::vector<std::shared_ptr<ChNodeFEAxyzrot>> my_el_nodes;
        for (int i_el_node = 0; i_el_node < p + 1; ++i_el_node) {
            my_el_nodes.push_back(mynodes[i_el + i_el_node]);
        }

        auto belement_i = chrono_types::make_shared<ChElementBeamIGA>();
        belement_i->SetNodesGenericOrder(my_el_nodes, my_el_knots, p);
        belement_i->SetSection(sect);
        mesh->AddElement(belement_i);
        this->beam_elems.push_back(belement_i);
    }
}